

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::stackUnder(QWidget *this,QWidget *w)

{
  bool bVar1;
  QWidgetPrivate *this_00;
  QWidget *t;
  QWidget *pQVar2;
  qsizetype qVar3;
  QWidget *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  undefined1 unaff_retaddr;
  undefined1 unaff_retaddr_00;
  WId in_stack_00000008;
  int to;
  int from;
  QWidget *p;
  QWidgetPrivate *d;
  QEvent e;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  QWidget *this_01;
  undefined1 *local_28;
  undefined1 *local_20;
  QWidget *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  this_00 = d_func((QWidget *)0x380c0f);
  t = parentWidget((QWidget *)0x380c1e);
  if ((((local_10 != (QWidget *)0x0) && (bVar1 = isWindow(in_RDI), !bVar1)) &&
      (this_01 = t, pQVar2 = parentWidget((QWidget *)0x380c4c), t == pQVar2)) &&
     (in_RDI != local_10)) {
    if (this_01 != (QWidget *)0x0) {
      d_func((QWidget *)0x380c7f);
      qVar3 = QListSpecialMethodsBase<QObject*>::indexOf<QWidget*>
                        ((QListSpecialMethodsBase<QObject_*> *)in_RDI,(QWidget **)t,0x380c9e);
      in_stack_ffffffffffffffbc = (int)qVar3;
      d_func((QWidget *)0x380cac);
      qVar3 = QListSpecialMethodsBase<QObject*>::indexOf<QWidget*>
                        ((QListSpecialMethodsBase<QObject_*> *)in_RDI,(QWidget **)t,0x380cc1);
      in_stack_ffffffffffffffb8 = (int)qVar3;
      if (in_stack_ffffffffffffffbc < in_stack_ffffffffffffffb8) {
        in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + -1;
      }
      if (in_stack_ffffffffffffffbc != in_stack_ffffffffffffffb8) {
        d_func((QWidget *)0x380cee);
        QList<QObject_*>::move
                  ((QList<QObject_*> *)this_01,
                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),(qsizetype)in_RDI);
      }
      bVar1 = testAttribute((QWidget *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                            ,(WidgetAttribute)((ulong)in_RDI >> 0x20));
      if ((bVar1) ||
         (bVar1 = testAttribute((QWidget *)
                                CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                (WidgetAttribute)((ulong)in_RDI >> 0x20)), !bVar1)) {
        if (in_stack_ffffffffffffffbc == in_stack_ffffffffffffffb8) goto LAB_00380db7;
      }
      else {
        create(_to,in_stack_00000008,(bool)unaff_retaddr_00,(bool)unaff_retaddr);
      }
    }
    bVar1 = testAttribute((QWidget *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                          (WidgetAttribute)((ulong)in_RDI >> 0x20));
    if (bVar1) {
      QWidgetPrivate::stackUnder_sys(this_00,this_01);
    }
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_28,ZOrderChange);
    QCoreApplication::sendEvent(&in_RDI->super_QObject,(QEvent *)&local_28);
    QEvent::~QEvent((QEvent *)&local_28);
  }
LAB_00380db7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::stackUnder(QWidget* w)
{
    Q_D(QWidget);
    QWidget *p = parentWidget();
    if (!w || isWindow() || p != w->parentWidget() || this == w)
        return;
    if (p) {
        int from = p->d_func()->children.indexOf(this);
        int to = p->d_func()->children.indexOf(w);
        Q_ASSERT(from >= 0);
        Q_ASSERT(to >= 0);
        if (from < to)
            --to;
        // Do nothing if the widget is already in correct stacking order _and_ created.
        if (from != to)
            p->d_func()->children.move(from, to);
        if (!testAttribute(Qt::WA_WState_Created) && p->testAttribute(Qt::WA_WState_Created))
            create();
        else if (from == to)
            return;
    }
    if (testAttribute(Qt::WA_WState_Created))
        d->stackUnder_sys(w);

    QEvent e(QEvent::ZOrderChange);
    QCoreApplication::sendEvent(this, &e);
}